

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

void __thiscall CRegexParser::build_char_range(CRegexParser *this,re_machine *machine,int exclusion)

{
  wchar_t *__dest;
  ulong __n;
  
  init_machine(this,machine);
  set_trans(this,machine->init,machine->final,RE_RANGE_EXCL - (exclusion == 0),L'\0');
  __n = this->range_buf_cnt_ << 2;
  __dest = (wchar_t *)operator_new__(-(ulong)(this->range_buf_cnt_ >> 0x3e != 0) | __n);
  memcpy(__dest,this->range_buf_,__n);
  this->tuple_arr_[machine->init].info.str.str = __dest;
  this->tuple_arr_[machine->init].info.range.char_range_cnt = this->range_buf_cnt_;
  return;
}

Assistant:

void CRegexParser::build_char_range(re_machine *machine,
                                    int exclusion)
{
    /* initialize our new machine */
    init_machine(machine);

    /* allocate a transition table for the new state */
    set_trans(machine->init, machine->final,
              (exclusion ? RE_RANGE_EXCL : RE_RANGE), 0);

    /* allocate a copy of the range vector */
    wchar_t *range_copy = new wchar_t[range_buf_cnt_];

    /* copy the caller's range */
    memcpy(range_copy, range_buf_, range_buf_cnt_ * sizeof(wchar_t));

    /* store it in the tuple */
    tuple_arr_[machine->init].info.range.char_range = range_copy;
    tuple_arr_[machine->init].info.range.char_range_cnt = range_buf_cnt_;
}